

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biattentional.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer ppVar1;
  vector<int,_std::allocator<int>_> *cg;
  int *piVar2;
  bool bVar3;
  __pid_t _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar9;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar10;
  typed_value<int,_char> *ptVar11;
  size_type sVar12;
  any *paVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  ostream *poVar15;
  uint *puVar16;
  void *pvVar17;
  size_type sVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar19;
  Tensor *pTVar20;
  string *psVar21;
  size_type __n;
  uint i;
  ulong uVar22;
  int *w;
  ulong uVar23;
  int *piVar24;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *spair;
  pointer target;
  ulong uVar25;
  VariableIndex VVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  double dVar36;
  undefined8 uVar39;
  undefined1 auVar37 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar40 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar41 [64];
  undefined1 in_XMM5 [16];
  double local_1038;
  double local_1030;
  double local_1020;
  double local_1018;
  double local_1010;
  double local_1000;
  int local_fd4;
  uint local_fd0;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  testing;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  training;
  int argc_local;
  double local_f58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_files;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  dev;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  string fname;
  char **argv_local;
  text_iarchive ia;
  ifstream in;
  SimpleSGDTrainer sgd;
  uint local_c30;
  float local_c2c;
  Model model;
  string line;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_b48 [144];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_ab8;
  BidirAttentionalModel<dynet::LSTMBuilder> am;
  options_description opts;
  undefined1 auVar38 [64];
  
  auVar40 = in_ZMM3._0_16_;
  auVar37 = in_ZMM2._0_16_;
  argc_local = argc;
  argv_local = argv;
  dynet::initialize(&argc_local,&argv_local,false);
  boost::program_options::variables_map::variables_map(&vm);
  std::__cxx11::string::string((string *)&am,"Allowed options",(allocator *)&in);
  boost::program_options::options_description::options_description
            (&opts,(string *)&am,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&am);
  am.s2t_model._0_8_ = boost::program_options::options_description::add_options();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&am,"help");
  ptVar9 = boost::program_options::value<std::__cxx11::string>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"config,c",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"train,t",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"devel,d",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"rescore,r",(char *)ptVar9);
  ptVar9 = boost::program_options::value<std::__cxx11::string>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"parameters,p",(char *)ptVar9);
  ptVar10 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"initialise,i",(char *)ptVar10);
  ptVar11 = boost::program_options::value<int>();
  _in = LAYERS;
  ptVar11 = boost::program_options::typed_value<int,_char>::default_value(ptVar11,(int *)&in);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"layers,l",(char *)ptVar11);
  ptVar11 = boost::program_options::value<int>();
  _model = ALIGN_DIM;
  ptVar11 = boost::program_options::typed_value<int,_char>::default_value(ptVar11,(int *)&model);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"align,a",(char *)ptVar11);
  ptVar11 = boost::program_options::value<int>();
  ia._0_4_ = HIDDEN_DIM;
  ptVar11 = boost::program_options::typed_value<int,_char>::default_value(ptVar11,(int *)&ia);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"hidden,h",(char *)ptVar11);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"bidirectional");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar8,"giza");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"gz-position");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"gz-markov");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"gz-fertility");
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"curriculum");
  boost::program_options::options_description_easy_init::operator()(pcVar8,"fertility,f");
  local_ab8.super_function_base.vtable = (vtable_base *)0x0;
  local_ab8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_ab8.super_function_base.functor._8_8_ = 0;
  local_ab8.super_function_base.functor._16_8_ = 0;
  auVar38 = ZEXT1664(auVar37);
  auVar41 = ZEXT1664(auVar40);
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&am,argc_local,argv_local,&opts,0,&local_ab8);
  boost::program_options::store((basic_parsed_options *)&am,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&am);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_ab8);
  std::__cxx11::string::string((string *)&am,"config",(allocator *)&in);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_b48,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  if (sVar12 != 0) {
    std::__cxx11::string::string((string *)&in,"config",(allocator *)&model);
    paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
    std::ifstream::ifstream(&am,(pbVar14->_M_dataplus)._M_p,_S_in);
    std::__cxx11::string::~string((string *)&in);
    boost::program_options::parse_config_file<char>
              ((istream *)&in,(options_description *)&am,SUB81(&opts,0));
    boost::program_options::store(&in,&vm,false);
    std::
    vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
    ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               *)&in);
    std::ifstream::~ifstream(&am);
  }
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&am,"help",(allocator *)&sgd);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_b48,(key_type *)&am);
  if (sVar12 == 0) {
    std::__cxx11::string::string((string *)&in,"train",(allocator *)&init_files);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_b48,(key_type *)&in);
    if (sVar12 != 1) {
      std::__cxx11::string::~string((string *)&in);
      goto LAB_00120a82;
    }
    std::__cxx11::string::string((string *)&model,"devel",(allocator *)&line);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_b48,(key_type *)&model);
    if (sVar12 == 1) {
      std::__cxx11::string::~string((string *)&model);
      std::__cxx11::string::~string((string *)&in);
      std::__cxx11::string::~string((string *)&am);
LAB_00120b50:
      std::__cxx11::string::string((string *)&am,"<s>",(allocator *)&in);
      kSRC_SOS = dynet::Dict::convert(&sd,(string *)&am);
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"</s>",(allocator *)&in);
      kSRC_EOS = dynet::Dict::convert(&sd,(string *)&am);
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"<s>",(allocator *)&in);
      kTGT_SOS = dynet::Dict::convert(&td,(string *)&am);
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"</s>",(allocator *)&in);
      kTGT_EOS = dynet::Dict::convert(&td,(string *)&am);
      std::__cxx11::string::~string((string *)&am);
      line._M_dataplus._M_p = (pointer)&line.field_2;
      training.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      dev.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      testing.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      line._M_string_length = 0;
      training.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      training.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dev.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      dev.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      testing.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      testing.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      line.field_2._M_local_buf[0] = '\0';
      poVar15 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
      std::__cxx11::string::string((string *)&am,"train",(allocator *)&in);
      paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
      poVar15 = std::operator<<(poVar15,(string *)pbVar14);
      std::operator<<(poVar15,"...\n");
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"train",(allocator *)&model);
      paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
      read_corpus((Corpus *)&in,pbVar14);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::_M_move_assign(&training,&in);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)&in);
      std::__cxx11::string::~string((string *)&am);
      sd.frozen = true;
      td.frozen = true;
      VOCAB_SIZE_SRC =
           (uint)((ulong)((long)sd.words_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sd.words_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
      VOCAB_SIZE_TGT =
           (uint)((ulong)((long)td.words_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)td.words_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
      std::__cxx11::string::string((string *)&am,"devel",(allocator *)&in);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&am);
      std::__cxx11::string::~string((string *)&am);
      if (sVar12 != 0) {
        poVar15 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
        std::__cxx11::string::string((string *)&am,"devel",(allocator *)&in);
        paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
        poVar15 = std::operator<<(poVar15,(string *)pbVar14);
        std::operator<<(poVar15,"...\n");
        std::__cxx11::string::~string((string *)&am);
        std::__cxx11::string::string((string *)&am,"devel",(allocator *)&model);
        paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
        read_corpus((Corpus *)&in,pbVar14);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::_M_move_assign(&dev,&in);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)&in);
        std::__cxx11::string::~string((string *)&am);
      }
      std::__cxx11::string::string((string *)&am,"rescore",(allocator *)&in);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&am);
      std::__cxx11::string::~string((string *)&am);
      if (sVar12 != 0) {
        poVar15 = std::operator<<((ostream *)&std::cerr,"Reading test data from ");
        std::__cxx11::string::string((string *)&am,"rescore",(allocator *)&in);
        paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
        poVar15 = std::operator<<(poVar15,(string *)pbVar14);
        std::operator<<(poVar15,"...\n");
        std::__cxx11::string::~string((string *)&am);
        std::__cxx11::string::string((string *)&am,"rescore",(allocator *)&model);
        paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar14 = boost::any_cast<std::__cxx11::string_const&>(paVar13);
        read_corpus((Corpus *)&in,pbVar14);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::_M_move_assign(&testing,&in);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)&in);
        std::__cxx11::string::~string((string *)&am);
      }
      std::__cxx11::string::string((string *)&am,"layers",(allocator *)&in);
      paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      puVar16 = (uint *)boost::any_cast<int_const&>(paVar13);
      LAYERS = *puVar16;
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"align",(allocator *)&in);
      paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      puVar16 = (uint *)boost::any_cast<int_const&>(paVar13);
      ALIGN_DIM = *puVar16;
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"hidden",(allocator *)&in);
      paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      puVar16 = (uint *)boost::any_cast<int_const&>(paVar13);
      HIDDEN_DIM = *puVar16;
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"bidirectional",(allocator *)&in);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&am);
      BIDIR = sVar12 != 0;
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"giza",(allocator *)&in);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&am);
      std::__cxx11::string::~string((string *)&am);
      if (sVar12 == 0) {
        std::__cxx11::string::string((string *)&am,"gz-position",(allocator *)&in);
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::count(local_b48,(key_type *)&am);
        GIZA_P = sVar12 != 0;
        std::__cxx11::string::~string((string *)&am);
        std::__cxx11::string::string((string *)&am,"gz-markov",(allocator *)&in);
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::count(local_b48,(key_type *)&am);
        GIZA_M = sVar12 != 0;
        std::__cxx11::string::~string((string *)&am);
        std::__cxx11::string::string((string *)&am,"gz-fertility",(allocator *)&in);
        sVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::count(local_b48,(key_type *)&am);
        GIZA_F = sVar12 != 0;
        std::__cxx11::string::~string((string *)&am);
      }
      else {
        GIZA_P = true;
        GIZA_M = true;
        GIZA_F = true;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      fname._M_string_length = 0;
      fname.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&am,"parameters",(allocator *)&in);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&am);
      std::__cxx11::string::~string((string *)&am);
      if (sVar12 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&am);
        poVar15 = std::operator<<((ostream *)&am,"bam");
        poVar15 = std::operator<<(poVar15,'_');
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        poVar15 = std::operator<<(poVar15,'_');
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        poVar15 = std::operator<<(poVar15,'_');
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
        poVar15 = std::operator<<(poVar15,"_lstm");
        poVar15 = std::operator<<(poVar15,"_b");
        poVar15 = std::ostream::_M_insert<bool>(SUB81(poVar15,0));
        poVar15 = std::operator<<(poVar15,"_g");
        pvVar17 = (void *)std::ostream::operator<<(poVar15,(uint)GIZA_P);
        pvVar17 = (void *)std::ostream::operator<<(pvVar17,(uint)GIZA_M);
        poVar15 = (ostream *)std::ostream::operator<<(pvVar17,(uint)GIZA_F);
        poVar15 = std::operator<<(poVar15,"-pid");
        _Var4 = getpid();
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,_Var4);
        std::operator<<(poVar15,".params");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&fname,(string *)&in);
        std::__cxx11::string::~string((string *)&in);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&am);
      }
      else {
        std::__cxx11::string::string((string *)&am,"parameters",(allocator *)&in);
        paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        boost::any_cast<std::__cxx11::string_const&>(paVar13);
        std::__cxx11::string::_M_assign((string *)&fname);
        std::__cxx11::string::~string((string *)&am);
      }
      std::__cxx11::string::string((string *)&am,"initialise",(allocator *)&in);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&am);
      std::__cxx11::string::~string((string *)&am);
      if (sVar12 == 0) {
        poVar15 = std::operator<<((ostream *)&std::cerr,"Parameters will be written to: ");
        poVar15 = std::operator<<(poVar15,(string *)&fname);
        std::endl<char,std::char_traits<char>>(poVar15);
      }
      dynet::Model::Model(&model);
      dynet::SimpleSGDTrainer::SimpleSGDTrainer(&sgd,&model,0.1,0.0);
      BidirAttentionalModel<dynet::LSTMBuilder>::BidirAttentionalModel(&am,&model,0.1);
      std::__cxx11::string::string((string *)&in,"rescore",(allocator *)&ia);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&in);
      std::__cxx11::string::~string((string *)&in);
      if (sVar12 != 0) {
        BidirAttentionalModel<dynet::LSTMBuilder>::add_fertility_params(&am,&model);
      }
      std::__cxx11::string::string((string *)&in,"initialise",(allocator *)&ia);
      sVar18 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&in);
      std::__cxx11::string::~string((string *)&in);
      if (sVar18 != 0) {
        std::__cxx11::string::string((string *)&in,"initialise",(allocator *)&ia);
        paVar13 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        __x = boost::
              any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                        (paVar13);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&init_files,__x);
        std::__cxx11::string::~string((string *)&in);
        lVar19 = (long)init_files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)init_files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (lVar19 == 2) {
          poVar15 = std::operator<<((ostream *)&std::cerr,"initialising from ");
          poVar15 = std::operator<<(poVar15,(string *)
                                            init_files.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
          poVar15 = std::operator<<(poVar15," and ");
          poVar15 = std::operator<<(poVar15,(string *)
                                            (init_files.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
          std::endl<char,std::char_traits<char>>(poVar15);
          BidirAttentionalModel<dynet::LSTMBuilder>::initialise
                    (&am,init_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                     init_files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,&model);
        }
        else {
          if (lVar19 != 1) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                          ,0x116,"int main(int, char **)");
          }
          poVar15 = std::operator<<((ostream *)&std::cerr,"Parameters will be loaded from: ");
          poVar15 = std::operator<<(poVar15,(string *)
                                            init_files.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
          std::endl<char,std::char_traits<char>>(poVar15);
          std::ifstream::ifstream
                    (&in,(string *)
                         init_files.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,_S_in);
          boost::archive::text_iarchive::text_iarchive(&ia,(istream *)&in,0);
          boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::
          load_standard::invoke<dynet::Model>(&ia,&model);
          boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
                    (&ia.super_text_iarchive_impl<boost::archive::text_iarchive>);
          std::ifstream::~ifstream(&in);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&init_files);
      }
      std::__cxx11::string::string((string *)&in,"fertility",(allocator *)&ia);
      sVar18 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&in);
      FERT = sVar18 != 0;
      std::__cxx11::string::~string((string *)&in);
      if ((sVar12 == 0) && (FERT != false)) {
        BidirAttentionalModel<dynet::LSTMBuilder>::add_fertility_params(&am,&model);
      }
      std::__cxx11::string::string((string *)&in,"rescore",(allocator *)&ia);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count(local_b48,(key_type *)&in);
      std::__cxx11::string::~string((string *)&in);
      if (sVar12 == 0) {
        __n = ((long)training.
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)training.
                    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&order,__n,(allocator_type *)&in);
        for (uVar29 = 0;
            (ulong)uVar29 <
            (ulong)((long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2); uVar29 = uVar29 + 1) {
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar29] = uVar29;
        }
        local_fd0 = 0;
        local_fd4 = 0;
        bVar3 = true;
        local_f58 = 9e+99;
        do {
          std::__cxx11::string::string((string *)&in,"completed in",(allocator *)&ia);
          dynet::Timer::Timer((Timer *)&init_files,(string *)&in);
          std::__cxx11::string::~string((string *)&in);
          local_fd4 = local_fd4 + 0x32;
          iVar6 = 0;
          local_1030 = 0.0;
          iVar5 = 0x32;
          iVar27 = 0;
          local_1020 = 0.0;
          local_1010 = 0.0;
          local_1018 = 0.0;
          iVar7 = 0;
          while( true ) {
            bVar30 = iVar5 == 0;
            iVar5 = iVar5 + -1;
            if (bVar30) break;
            if (((long)training.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)training.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30 == (__n & 0xffffffff)) {
              if (!bVar3) {
                auVar38 = ZEXT464(0x3f800000);
                local_c2c = local_c2c + 1.0;
                vfmadd132ss_fma(ZEXT416((uint)local_c2c),auVar38._0_16_,ZEXT416(local_c30));
              }
              std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
              __n = 0;
              std::
              shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                        ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,dynet::rndeng);
              bVar3 = false;
            }
            dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&in);
            cg = &training.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[__n & 0xffffffff]].second;
            ppVar1 = training.
                     super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[__n & 0xffffffff];
            uVar22 = (long)(cg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(cg->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar23 = (long)(((pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                              *)(cg + -1))->first).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(((pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
                              *)(cg + -1))->first).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2;
            uVar25 = uVar22;
            if (uVar22 < uVar23) {
              uVar25 = uVar23;
            }
            BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                      ((BidirAttentionalModel<dynet::LSTMBuilder> *)&ia,
                       (vector<int,_std::allocator<int>_> *)&am,&ppVar1->first,
                       (ComputationGraph *)cg);
            pTVar20 = (Tensor *)dynet::ComputationGraph::forward((Expression *)&in);
            fVar31 = (float)dynet::as_scalar(pTVar20);
            pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
            fVar32 = (float)dynet::as_scalar(pTVar20);
            pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
            fVar33 = (float)dynet::as_scalar(pTVar20);
            pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
            fVar34 = (float)dynet::as_scalar(pTVar20);
            dynet::ComputationGraph::backward((Expression *)&in);
            dynet::Trainer::update(1.0);
            if ((int)__n == 0) {
              dynet::AttentionalModel<dynet::LSTMBuilder>::display_ascii
                        (&am.s2t_model,&ppVar1->first,cg,(ComputationGraph *)&in,&am.s2t_align,&sd,
                         &td);
              dynet::AttentionalModel<dynet::LSTMBuilder>::display_ascii
                        (&am.t2s_model,cg,&ppVar1->first,(ComputationGraph *)&in,&am.t2s_align,&td,
                         &sd);
              poVar15 = std::operator<<((ostream *)&std::cerr,"\txent_s2t ");
              pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
              fVar35 = (float)dynet::as_scalar(pTVar20);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,fVar35);
              poVar15 = std::operator<<(poVar15,"\txent_t2s ");
              pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
              fVar35 = (float)dynet::as_scalar(pTVar20);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,fVar35);
              poVar15 = std::operator<<(poVar15,"\ttrace ");
              pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
              fVar35 = (float)dynet::as_scalar(pTVar20);
              poVar15 = (ostream *)std::ostream::operator<<(poVar15,fVar35);
              std::endl<char,std::char_traits<char>>(poVar15);
            }
            iVar6 = iVar6 + -1 + (int)uVar23;
            __n = (size_type)((int)__n + 1);
            local_1030 = local_1030 + (double)fVar31;
            iVar7 = iVar7 + -1 + (int)uVar22;
            iVar27 = iVar27 + -1 + (int)uVar25;
            local_1020 = local_1020 + (double)fVar32;
            local_1010 = local_1010 + (double)fVar33;
            local_1018 = local_1018 + (double)fVar34;
            dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&in);
          }
          dynet::Trainer::status((Trainer *)&sgd);
          std::operator<<((ostream *)&std::cerr," E = ");
          auVar37 = vcvtusi2sd_avx512f(auVar38._0_16_,iVar6 + iVar7);
          local_1030 = local_1030 / auVar37._0_8_;
          poVar15 = std::ostream::_M_insert<double>(local_1030);
          std::operator<<(poVar15," ppl=");
          dVar36 = exp(local_1030);
          poVar15 = std::ostream::_M_insert<double>(dVar36);
          std::operator<<(poVar15,' ');
          std::operator<<((ostream *)&std::cerr," ppl_s = ");
          auVar37 = vcvtusi2sd_avx512f(auVar38._0_16_,iVar6);
          dVar36 = exp(local_1010 / auVar37._0_8_);
          poVar15 = std::ostream::_M_insert<double>(dVar36);
          std::operator<<(poVar15,' ');
          std::operator<<((ostream *)&std::cerr," ppl_t = ");
          auVar37 = vcvtusi2sd_avx512f(auVar38._0_16_,iVar7);
          dVar36 = exp(local_1020 / auVar37._0_8_);
          poVar15 = std::ostream::_M_insert<double>(dVar36);
          std::operator<<(poVar15,' ');
          std::operator<<((ostream *)&std::cerr," trace = ");
          auVar37 = vcvtusi2sd_avx512f(auVar38._0_16_,iVar27);
          dVar36 = exp(local_1018 / auVar37._0_8_);
          poVar15 = std::ostream::_M_insert<double>(dVar36);
          std::operator<<(poVar15,' ');
          ppVar1 = dev.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_fd0 = local_fd0 + 1;
          if (local_fd0 % 500 == 0) {
            iVar7 = 0;
            iVar5 = 0;
            iVar6 = 0;
            local_1038 = 0.0;
            local_1030 = 0.0;
            local_1010 = 0.0;
            local_1018 = 0.0;
            for (target = dev.
                          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; target != ppVar1;
                target = target + 1) {
              dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&in);
              BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                        ((BidirAttentionalModel<dynet::LSTMBuilder> *)&ia,
                         (vector<int,_std::allocator<int>_> *)&am,&target->first,
                         (ComputationGraph *)&target->second);
              pTVar20 = (Tensor *)dynet::ComputationGraph::incremental_forward((Expression *)&in);
              fVar31 = (float)dynet::as_scalar(pTVar20);
              VVar26.t = (uint)(Expression *)&in;
              pTVar20 = (Tensor *)dynet::ComputationGraph::get_value(VVar26);
              fVar32 = (float)dynet::as_scalar(pTVar20);
              pTVar20 = (Tensor *)dynet::ComputationGraph::get_value(VVar26);
              fVar33 = (float)dynet::as_scalar(pTVar20);
              pTVar20 = (Tensor *)dynet::ComputationGraph::get_value(VVar26);
              fVar34 = (float)dynet::as_scalar(pTVar20);
              uVar22 = (long)(target->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(target->first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
              uVar25 = (long)(target->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(target->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
              iVar5 = iVar5 + -1 + (int)uVar25;
              iVar7 = iVar7 + -1 + (int)uVar22;
              if (uVar25 < uVar22) {
                uVar25 = uVar22;
              }
              local_1038 = local_1038 + (double)fVar31;
              iVar6 = iVar6 + -1 + (int)uVar25;
              local_1030 = local_1030 + (double)fVar32;
              local_1010 = local_1010 + (double)fVar33;
              auVar38 = ZEXT864((ulong)local_1010);
              local_1018 = local_1018 + (double)fVar34;
              dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&in);
            }
            if (local_1038 < local_f58) {
              std::ofstream::ofstream(&in,(string *)&fname,_S_out);
              boost::archive::text_oarchive::text_oarchive((text_oarchive *)&ia,(ostream *)&in,0);
              boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::
              save_standard::invoke<dynet::Model>((text_oarchive *)&ia,&model);
              boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::~text_oarchive_impl
                        ((text_oarchive_impl<boost::archive::text_oarchive> *)&ia);
              std::ofstream::~ofstream(&in);
              local_f58 = local_1038;
            }
            std::operator<<((ostream *)&std::cerr,"\n***DEV [epoch=");
            auVar37 = vcvtusi2sd_avx512f(auVar41._0_16_,local_fd4);
            auVar40 = vcvtusi2sd_avx512f(auVar41._0_16_,
                                         ((long)training.
                                                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)training.
                                               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
            poVar15 = std::ostream::_M_insert<double>(auVar37._0_8_ / auVar40._0_8_);
            std::operator<<(poVar15,"]");
            std::operator<<((ostream *)&std::cerr," E = ");
            auVar37 = vcvtusi2sd_avx512f(auVar41._0_16_,iVar5 + iVar7);
            local_1038 = local_1038 / auVar37._0_8_;
            poVar15 = std::ostream::_M_insert<double>(local_1038);
            std::operator<<(poVar15," ppl=");
            dVar36 = exp(local_1038);
            poVar15 = std::ostream::_M_insert<double>(dVar36);
            std::operator<<(poVar15,' ');
            std::operator<<((ostream *)&std::cerr," ppl_s = ");
            auVar37 = vcvtusi2sd_avx512f(auVar41._0_16_,iVar7);
            dVar36 = exp(local_1010 / auVar37._0_8_);
            poVar15 = std::ostream::_M_insert<double>(dVar36);
            std::operator<<(poVar15,' ');
            std::operator<<((ostream *)&std::cerr," ppl_t = ");
            auVar37 = vcvtusi2sd_avx512f(auVar41._0_16_,iVar5);
            dVar36 = exp(local_1030 / auVar37._0_8_);
            poVar15 = std::ostream::_M_insert<double>(dVar36);
            std::operator<<(poVar15,' ');
            std::operator<<((ostream *)&std::cerr," trace = ");
            auVar37 = vcvtusi2sd_avx512f(auVar41._0_16_,iVar6);
            dVar36 = exp(local_1018 / auVar37._0_8_);
            poVar15 = std::ostream::_M_insert<double>(dVar36);
            std::operator<<(poVar15,' ');
          }
          dynet::Timer::~Timer((Timer *)&init_files);
        } while( true );
      }
      uVar29 = 0;
      iVar5 = 0;
      iVar6 = 0;
      iVar7 = 0;
      local_1018 = 0.0;
      local_1000 = 0.0;
      local_1010 = 0.0;
      local_1020 = 0.0;
      while( true ) {
        auVar37 = auVar38._0_16_;
        uVar39 = auVar38._8_8_;
        uVar25 = (ulong)uVar29;
        if ((ulong)(((long)testing.
                           super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)testing.
                          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar25) break;
        dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&in);
        BidirAttentionalModel<dynet::LSTMBuilder>::build_graph
                  ((BidirAttentionalModel<dynet::LSTMBuilder> *)&ia,
                   (vector<int,_std::allocator<int>_> *)&am,
                   &testing.
                    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].first,
                   (ComputationGraph *)
                   &testing.
                    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar25].second);
        uVar23 = (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].second.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish -
                 (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].second.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start >> 2;
        uVar28 = (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish -
                 (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start >> 2;
        uVar22 = uVar23;
        if (uVar23 < uVar28) {
          uVar22 = uVar28;
        }
        pTVar20 = (Tensor *)dynet::ComputationGraph::forward((Expression *)&in);
        fVar31 = (float)dynet::as_scalar(pTVar20);
        pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
        fVar32 = (float)dynet::as_scalar(pTVar20);
        pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
        fVar33 = (float)dynet::as_scalar(pTVar20);
        pTVar20 = (Tensor *)dynet::ComputationGraph::get_value((VariableIndex)(uint)&in);
        fVar34 = (float)dynet::as_scalar(pTVar20);
        poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar15," |||");
        dVar36 = (double)fVar33;
        auVar38 = ZEXT1664(CONCAT88(uVar39,dVar36));
        iVar5 = iVar5 + -1 + (int)uVar28;
        local_1018 = local_1018 + (double)fVar31;
        iVar6 = iVar6 + -1 + (int)uVar23;
        local_1000 = local_1000 + (double)fVar32;
        iVar7 = iVar7 + -1 + (int)uVar22;
        piVar2 = testing.
                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        local_1010 = local_1010 + dVar36;
        local_1020 = local_1020 + (double)fVar34;
        for (piVar24 = testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar24 != piVar2; piVar24 = piVar24 + 1) {
          poVar15 = std::operator<<((ostream *)&std::cout," ");
          psVar21 = dynet::Dict::convert_abi_cxx11_(&sd,piVar24);
          std::operator<<(poVar15,(string *)psVar21);
        }
        std::operator<<((ostream *)&std::cout," |||");
        piVar2 = testing.
                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar25].second.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        for (piVar24 = testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].second.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start; piVar24 != piVar2; piVar24 = piVar24 + 1) {
          poVar15 = std::operator<<((ostream *)&std::cout," ");
          psVar21 = dynet::Dict::convert_abi_cxx11_(&td,piVar24);
          std::operator<<(poVar15,(string *)psVar21);
        }
        std::operator<<((ostream *)&std::cout," ||| ");
        auVar37 = vcvtusi2sd_avx512f(in_XMM5,((long)testing.
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  second.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                              (long)testing.
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  second.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2) +
                                             -1);
        poVar15 = std::ostream::_M_insert<double>((double)fVar32 / auVar37._0_8_);
        std::operator<<(poVar15," ");
        auVar37 = vcvtusi2sd_avx512f(in_XMM5,((long)testing.
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  first.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                              (long)testing.
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  first.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2) +
                                             -1);
        poVar15 = std::ostream::_M_insert<double>(dVar36 / auVar37._0_8_);
        std::operator<<(poVar15," ");
        uVar22 = (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish -
                 (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].first.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start >> 2;
        uVar25 = (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].second.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish -
                 (long)testing.
                       super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar25].second.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start >> 2;
        if (uVar25 < uVar22) {
          uVar25 = uVar22;
        }
        auVar37 = vcvtusi2sd_avx512f(in_XMM5,uVar25 - 1);
        poVar15 = std::ostream::_M_insert<double>((double)fVar34 / auVar37._0_8_);
        std::endl<char,std::char_traits<char>>(poVar15);
        dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&in);
        uVar29 = uVar29 + 1;
      }
      poVar15 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      std::operator<<(poVar15," E = ");
      auVar40 = vcvtusi2sd_avx512f(auVar37,iVar6 + iVar5);
      local_1018 = local_1018 / auVar40._0_8_;
      poVar15 = std::ostream::_M_insert<double>(local_1018);
      std::operator<<(poVar15," ppl=");
      dVar36 = exp(local_1018);
      poVar15 = std::ostream::_M_insert<double>(dVar36);
      std::operator<<(poVar15,' ');
      std::operator<<((ostream *)&std::cerr," ppl_s = ");
      auVar40 = vcvtusi2sd_avx512f(auVar37,iVar5);
      dVar36 = exp(local_1010 / auVar40._0_8_);
      poVar15 = std::ostream::_M_insert<double>(dVar36);
      std::operator<<(poVar15,' ');
      std::operator<<((ostream *)&std::cerr," ppl_t = ");
      auVar40 = vcvtusi2sd_avx512f(auVar37,iVar6);
      dVar36 = exp(local_1000 / auVar40._0_8_);
      poVar15 = std::ostream::_M_insert<double>(dVar36);
      std::operator<<(poVar15,' ');
      std::operator<<((ostream *)&std::cerr," trace = ");
      auVar37 = vcvtusi2sd_avx512f(auVar37,iVar7);
      dVar36 = exp(local_1020 / auVar37._0_8_);
      poVar15 = std::ostream::_M_insert<double>(dVar36);
      std::endl<char,std::char_traits<char>>(poVar15);
      BidirAttentionalModel<dynet::LSTMBuilder>::~BidirAttentionalModel(&am);
      dynet::Trainer::~Trainer((Trainer *)&sgd);
      dynet::Model::~Model(&model);
      std::__cxx11::string::~string((string *)&fname);
      std::__cxx11::string::~string((string *)&line);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector(&testing);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector(&dev);
      std::
      vector<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector(&training);
      iVar5 = 0;
      goto LAB_00120ab5;
    }
    std::__cxx11::string::string((string *)&ia,"rescore",(allocator *)&fname);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_b48,(key_type *)&ia);
    std::__cxx11::string::~string((string *)&ia);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::string::~string((string *)&in);
    std::__cxx11::string::~string((string *)&am);
    if (sVar12 == 1) goto LAB_00120b50;
  }
  else {
LAB_00120a82:
    std::__cxx11::string::~string((string *)&am);
  }
  poVar15 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&opts);
  std::operator<<(poVar15,"\n");
  iVar5 = 1;
LAB_00120ab5:
  boost::program_options::options_description::~options_description(&opts);
  boost::program_options::variables_map::~variables_map(&vm);
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
    dynet::initialize(argc, argv);

    // command line processing
    variables_map vm; 
    options_description opts("Allowed options");
    opts.add_options()
        ("help", "print help message")
        ("config,c", value<string>(), "config file specifying additional command line options")
        ("train,t", value<string>(), "file containing training sentences, with "
            "each line consisting of source ||| target.")
        ("devel,d", value<string>(), "file containing development sentences.")
        ("rescore,r", value<string>(), "rescore (source, target) sentence pairs")
        ("parameters,p", value<string>(), "save best parameters to this file")
        ("initialise,i", value<vector<string>>(), "load initial parameters from file")
        ("layers,l", value<int>()->default_value(LAYERS), "use <num> layers for RNN components")
        ("align,a", value<int>()->default_value(ALIGN_DIM), "use <num> dimensions for alignment projection")
        ("hidden,h", value<int>()->default_value(HIDDEN_DIM), "use <num> dimensions for recurrent hidden states")
        ("bidirectional", "use bidirectional recurrent hidden states as source embeddings, rather than word embeddings")
        ("giza", "use GIZA++ style features in attentional components (corresponds to all of the 'gz' options)")
        ("gz-position", "use GIZA++ positional index features")
        ("gz-markov", "use GIZA++ markov context features")
        ("gz-fertility", "use GIZA++ fertility type features")
        ("curriculum", "use 'curriculum' style learning, focusing on easy problems in earlier epochs")
        ("fertility,f", "learn Normal model of word fertility values")
    ;
    store(parse_command_line(argc, argv, opts), vm); 
    if (vm.count("config") > 0)
    {
        ifstream config(vm["config"].as<string>().c_str());
        store(parse_config_file(config, opts), vm); 
    }
    notify(vm);
    
    if (vm.count("help") || vm.count("train") != 1 || (vm.count("devel") != 1 && vm.count("rescore") != 1)) {
        cout << opts << "\n";
        return 1;
    }

    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");

    typedef vector<int> Sentence;
    typedef pair<Sentence, Sentence> SentencePair;
    vector<SentencePair> training, dev, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>());
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    VOCAB_SIZE_SRC = sd.size();
    VOCAB_SIZE_TGT = td.size();

    if (vm.count("devel")) {
        cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
        dev = read_corpus(vm["devel"].as<string>());
    }

    if (vm.count("rescore")) {
        cerr << "Reading test data from " << vm["rescore"].as<string>() << "...\n";
        testing = read_corpus(vm["rescore"].as<string>());
    }

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    BIDIR = vm.count("bidirectional");
    bool giza = vm.count("giza");
    GIZA_P = giza || vm.count("gz-position");
    GIZA_M = giza || vm.count("gz-markov");
    GIZA_F = giza || vm.count("gz-fertility");
    //FERT = vm.count("fertility");

    string fname;
    if (!vm.count("parameters")) {
        ostringstream os;
        os << "bam"
            << '_' << LAYERS
            << '_' << HIDDEN_DIM
            << '_' << ALIGN_DIM
            << "_lstm"
            << "_b" << BIDIR
	    << "_g" << (int)GIZA_P << (int)GIZA_M << (int)GIZA_F
            << "-pid" << getpid() << ".params";
        fname = os.str();
    }
    else {
        fname = vm["parameters"].as<string>();
    }

    if (!vm.count("initialise")) cerr << "Parameters will be written to: " << fname << endl;

    double best = 9e+99;

    Model model;
    SimpleSGDTrainer sgd(model);
    BidirAttentionalModel<LSTMBuilder> am(&model, 0.1);

    bool add_fer = false;
    if (vm.count("rescore"))
    {
    	am.add_fertility_params(&model);
    	add_fer = true;
    }

    if (vm.count("initialise")) {
        vector<string> init_files = vm["initialise"].as<vector<string>>();
        if (init_files.size() == 1) {
        	cerr << "Parameters will be loaded from: " << init_files[0] << endl;

            ifstream in(init_files[0]);
            boost::archive::text_iarchive ia(in);
            ia >> model;
        } else if (init_files.size() == 2) {
            cerr << "initialising from " << init_files[0] << " and " << init_files[1] << endl;
            am.initialise(init_files[0], init_files[1], model);
        } else {
            assert(false);
        }
    }

    FERT = vm.count("fertility");
    if (FERT && !add_fer) am.add_fertility_params(&model);

        if (false) {
            double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
            unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
            unsigned i = 0;
            for (auto& spair : dev) {
                ComputationGraph cg;
                auto idloss = am.build_graph(spair.first, spair.second, cg);
                dloss += as_scalar(cg.incremental_forward(idloss));
                dloss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
                dloss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
                dloss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
                dchars_s += spair.first.size() - 1;
                dchars_t += spair.second.size() - 1;
                dchars_tt += std::max(spair.first.size(), spair.second.size()) - 1;

                if (true)
                {
                    cout << "\n===== SENTENCE " << i++ << " =====\n";
                    am.s2t_model.display_tikz(spair.first, spair.second, cg, am.s2t_align, sd, td);
                    cout << "\n";
                    am.t2s_model.display_tikz(spair.second, spair.first, cg, am.t2s_align, td, sd);
                    cout << "\n";
                }
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(fname);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=0]";
            cerr << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
            cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
            cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
            cerr << " trace = " << exp(dloss_trace / dchars_tt) << ' ';
        }

    if (vm.count("rescore")) {
    	double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
    	unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
    	for (unsigned i = 0; i < testing.size(); ++i) {
            ComputationGraph cg;
            auto idloss = am.build_graph(testing[i].first, testing[i].second, cg);

            dchars_s += testing[i].first.size() - 1;
            dchars_t += testing[i].second.size() - 1;
            dchars_tt += std::max(testing[i].first.size(), testing[i].second.size()) - 1; // max or min?

            //cg.forward();
            dloss += as_scalar(cg.forward(idloss));

            double loss_s2t = as_scalar(cg.get_value(am.s2t_xent.i));
            double loss_t2s = as_scalar(cg.get_value(am.t2s_xent.i));
            double loss_trace = as_scalar(cg.get_value(am.trace_bonus.i));

            dloss_s2t += loss_s2t;
            dloss_t2s += loss_t2s;
            dloss_trace += loss_trace;

            cout << i << " |||";
            for (auto &w: testing[i].first)
                cout << " " << sd.convert(w);
            cout << " |||";
            for (auto &w: testing[i].second)
                cout << " " << td.convert(w);
            cout << " ||| " << (loss_s2t / (testing[i].second.size()-1))
                << " " << (loss_t2s / (testing[i].first.size()-1))
                << " " << (loss_trace / (std::max(testing[i].first.size(), testing[i].second.size())-1)) 
                << std::endl;
        }

    	cerr <<endl << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
    	cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
    	cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
    	cerr << " trace = " << exp(dloss_trace / dchars_tt) << endl;

        return 0;
    }

    unsigned report_every_i = 50;
    unsigned dev_every_i_reports = 500; // 500
    unsigned si = training.size();
    vector<unsigned> order(training.size());
    for (unsigned i = 0; i < order.size(); ++i) order[i] = i;
    bool first = true;
    int report = 0;
    unsigned lines = 0;
    while(1) {
        Timer iteration("completed in");
        double loss = 0, loss_s2t = 0, loss_t2s = 0, loss_trace = 0;
        unsigned chars_s = 0, chars_t = 0, chars_tt = 0;
        for (unsigned i = 0; i < report_every_i; ++i) {
            if (si == training.size()) {
                si = 0;
                if (first) { first = false; } else { sgd.update_epoch(); }
                cerr << "**SHUFFLE\n";
                shuffle(order.begin(), order.end(), *rndeng);
            }

            // build graph for this instance
            ComputationGraph cg;
            auto& spair = training[order[si]];
            chars_s += spair.first.size() - 1;
            chars_t += spair.second.size() - 1;
            chars_tt += std::max(spair.first.size(), spair.second.size()) - 1; // max or min?
            ++si;
            auto iloss = am.build_graph(spair.first, spair.second, cg);
            loss += as_scalar(cg.forward(iloss));
            loss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
            loss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
            loss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
            cg.backward(iloss);
            sgd.update(1.0f);
            ++lines;

            //if ((i+1) == report_every_i) 
            if (si == 1) {
		//Expression aligns = concatenate({transpose(am.src_align), am.tgt_align});
		//cerr << cg.get_value(aligns.i) << "\n";
                am.s2t_model.display_ascii(spair.first, spair.second, cg, am.s2t_align, sd, td);
                am.t2s_model.display_ascii(spair.second, spair.first, cg, am.t2s_align, td, sd);
		cerr << "\txent_s2t " << as_scalar(cg.get_value(am.s2t_xent.i))
		     << "\txent_t2s " << as_scalar(cg.get_value(am.t2s_xent.i))
		     << "\ttrace " << as_scalar(cg.get_value(am.trace_bonus.i)) << endl;
            }
        }
        sgd.status();
        cerr << " E = " << (loss / (chars_s + chars_t)) << " ppl=" << exp(loss / (chars_s + chars_t)) << ' '; // kind of hacky, as trace should be normalised differently
        cerr << " ppl_s = " << exp(loss_t2s / chars_s) << ' ';
        cerr << " ppl_t = " << exp(loss_s2t / chars_t) << ' ';
        cerr << " trace = " << exp(loss_trace / chars_tt) << ' ';

        // show score on dev data?
        report++;
        if (report % dev_every_i_reports == 0) {
            double dloss = 0, dloss_s2t = 0, dloss_t2s = 0, dloss_trace = 0;
            unsigned dchars_s = 0, dchars_t = 0, dchars_tt = 0;
            for (auto& spair : dev) {
                ComputationGraph cg;
                auto idloss = am.build_graph(spair.first, spair.second, cg);
                dloss += as_scalar(cg.incremental_forward(idloss));
                dloss_s2t += as_scalar(cg.get_value(am.s2t_xent.i));
                dloss_t2s += as_scalar(cg.get_value(am.t2s_xent.i));
                dloss_trace += as_scalar(cg.get_value(am.trace_bonus.i));
                dchars_s += spair.first.size() - 1;
                dchars_t += spair.second.size() - 1;
                dchars_tt += std::max(spair.first.size(), spair.second.size()) - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(fname);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "]";
            cerr << " E = " << (dloss / (dchars_s + dchars_t)) << " ppl=" << exp(dloss / (dchars_s + dchars_t)) << ' '; // kind of hacky, as trace should be normalised differently
            cerr << " ppl_s = " << exp(dloss_t2s / dchars_s) << ' ';
            cerr << " ppl_t = " << exp(dloss_s2t / dchars_t) << ' ';
            cerr << " trace = " << exp(dloss_trace / dchars_tt) << ' ';
        }
    }

    return 0;
}